

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dma_write.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  nettlp *__buf;
  char *__s;
  uint16_t devn;
  uint16_t busn;
  int local_1064;
  uintptr_t addr;
  nettlp nt;
  char buf [4096];
  
  nt.sockfd = 0;
  nt.port = 0;
  nt._22_2_ = 0;
  addr = 0;
  busn = 0;
  devn = 0;
  nt.remote_addr.s_addr = 0;
  nt.local_addr.s_addr = 0;
  nt.requester = 0;
  nt.tag = '\0';
  nt._11_1_ = 0;
  nt.dir = DMA_ISSUED_BY_LIBTLP;
  uVar2 = 0;
  local_1064 = 0;
LAB_0010249c:
  iVar1 = getopt(argc,argv,"r:l:b:t:a:s:p:m:");
  switch(iVar1) {
  case 0x61:
    __isoc99_sscanf(_optarg,"0x%lx",&addr);
    goto LAB_0010249c;
  case 0x62:
    __isoc99_sscanf(_optarg,"%hx:%hx",&busn,&devn);
    nt.requester = busn << 8 | devn;
    goto LAB_0010249c;
  case 0x6c:
    __buf = (nettlp *)&nt.local_addr;
    break;
  case 0x6d:
    local_1064 = atoi(_optarg);
    goto LAB_0010249c;
  case 0x70:
    strncpy(buf,_optarg,0x1000);
    goto LAB_0010249c;
  case 0x72:
    __buf = &nt;
    break;
  case 0x73:
    goto switchD_001024bd_caseD_73;
  case 0x74:
    iVar1 = atoi(_optarg);
    nt.tag = (uint8_t)iVar1;
    goto LAB_0010249c;
  default:
    if (iVar1 == -1) {
      iVar1 = nettlp_init(&nt);
      if (iVar1 < 0) {
        __s = "nettlp_init";
      }
      else {
        dump_nettlp(&nt);
        printf("start DMA write, to 0x%lx, payload=\'%s\', size %d-byte\n",addr,buf,(ulong)uVar2);
        if (local_1064 == 0) {
          uVar3 = dma_write(&nt,addr,buf,(long)(int)uVar2);
        }
        else {
          uVar3 = dma_write_aligned(&nt,addr,buf,(long)(int)uVar2,(long)local_1064);
        }
        iVar1 = 0;
        printf("dma_write to 0x%lx returns %d\n",addr,uVar3 & 0xffffffff);
        if (-1 < (int)uVar3) {
          return 0;
        }
        __s = "dma_read";
      }
      perror(__s);
      return iVar1;
    }
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x71:
    usage();
    return -1;
  }
  iVar1 = inet_pton(2,_optarg,__buf);
  if (iVar1 < 1) {
    perror("inet_pton");
    return -1;
  }
  goto LAB_0010249c;
switchD_001024bd_caseD_73:
  uVar2 = atoi(_optarg);
  if (0x1000 < (int)uVar2) {
    fwrite("too large size\n",0xf,1,_stderr);
    return -1;
  }
  goto LAB_0010249c;
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, size, mps;
	struct nettlp nt;
	uintptr_t addr;
	uint16_t busn, devn;
	char buf[4096];

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;
	mps = 0;

	size = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:s:p:m:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'p':
			strncpy(buf, optarg, sizeof(buf));
			break;

		case 's':
			size = atoi(optarg);
			if (size > 4096) {
				fprintf(stderr, "too large size\n");
				return -1;
			}
			break;

		case 'm':
			mps = atoi(optarg);
			break;

		default :
			usage();
			return -1;
		}
	}

	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}
	dump_nettlp(&nt);

	printf("start DMA write, to 0x%lx, payload='%s', size %d-byte\n",
	       addr, buf, size);

	if (mps)
		ret = dma_write_aligned(&nt, addr, buf, size, mps);
	else
		ret = dma_write(&nt, addr, buf, size);

	printf("dma_write to 0x%lx returns %d\n", addr, ret);

	if (ret < 0)
		perror("dma_read");


	return 0;
}